

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O0

void printbits2(uint8_t *k,int nbytes)

{
  byte bVar1;
  int in_ESI;
  long in_RDI;
  uint8_t c;
  int j;
  uint8_t b;
  int i;
  byte local_1a;
  int local_18;
  int local_10;
  
  printf("[");
  for (local_10 = in_ESI + -1; -1 < local_10; local_10 = local_10 + -1) {
    bVar1 = *(byte *)(in_RDI + local_10);
    for (local_18 = 7; -1 < local_18; local_18 = local_18 + -1) {
      local_1a = 0x23;
      if (((uint)bVar1 & 1 << ((byte)local_18 & 0x1f)) == 0) {
        local_1a = 0x20;
      }
      putc((uint)local_1a,_stdout);
    }
  }
  printf("]");
  return;
}

Assistant:

void printbits2 ( const uint8_t * k, int nbytes )
{
  printf("[");

  for(int i = nbytes-1; i >= 0; i--)
  {
    uint8_t b = k[i];

    for(int j = 7; j >= 0; j--)
    {
      uint8_t c = (b & (1 << j)) ? '#' : ' ';

      putc(c,stdout);
    }
  }
  printf("]");
}